

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minShortLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *sel,int leave,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *maxabs)

{
  type_conflict5 tVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  long lVar3;
  pointer pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  ulong uVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  
  bVar7 = 0;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar8 = -(ulong)(*(double *)(result.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&shortval.m_backend,
             (double)(~uVar8 & (ulong)(*(double *)(result.m_backend.data._M_elems._0_8_ + 0x40) *
                                      1e-05) | uVar8 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.m_backend.data._M_elems + 2));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](&result,&((this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).thesolver)->theFvec->thedelta,leave);
  pnVar5 = &result;
  pnVar6 = sel;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = *(uint *)pnVar5;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  (sel->m_backend).exp = result.m_backend.exp;
  (sel->m_backend).neg = result.m_backend.neg;
  (sel->m_backend).fpclass = result.m_backend.fpclass;
  (sel->m_backend).prec_elem = result.m_backend.prec_elem;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&maxabs->m_backend,&shortval.m_backend);
  tVar1 = boost::multiprecision::operator>(sel,&result);
  if (tVar1) {
    pSVar2 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar2->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pnVar5 = maxabs;
    pnVar6 = &result_1;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    result_1.m_backend.exp = (maxabs->m_backend).exp;
    result_1.m_backend.neg = (maxabs->m_backend).neg;
    result_1.m_backend.fpclass = (maxabs->m_backend).fpclass;
    result_1.m_backend.prec_elem = (maxabs->m_backend).prec_elem;
    if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,&result_1.m_backend,&shortval.m_backend);
    tVar1 = boost::multiprecision::operator<(sel,&result);
    if (!tVar1) {
      return false;
    }
    pSVar2 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar2->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,&pnVar4[leave].m_backend,
             &(pSVar2->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[leave].m_backend);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&result_1.m_backend,&sel->m_backend);
  pnVar5 = &result;
  pnVar6 = sel;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = *(uint *)pnVar5;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  (sel->m_backend).exp = result.m_backend.exp;
  (sel->m_backend).neg = result.m_backend.neg;
  (sel->m_backend).fpclass = result.m_backend.fpclass;
  (sel->m_backend).prec_elem = result.m_backend.prec_elem;
  return true;
}

Assistant:

bool SPxFastRT<R>::minShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}